

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string * __thiscall
google::protobuf::Symbol::GetVisibilityError_abi_cxx11_
          (string *__return_storage_ptr__,Symbol *this,FileDescriptor *other,string_view usage)

{
  byte bVar1;
  uint v;
  SymbolBase *pSVar2;
  FileDescriptor *pFVar3;
  FeatureSet *pFVar4;
  string *psVar5;
  AlphaNum *c;
  AlphaNum *in_R9;
  pointer pcVar6;
  char *pcVar7;
  string_view sVar8;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  string reason;
  undefined1 local_170 [48];
  AlphaNum local_140;
  AlphaNum local_110;
  undefined8 local_e0;
  char *local_d8;
  string_view local_d0;
  undefined8 local_c0;
  char *local_b8;
  pointer local_b0;
  pointer local_a8;
  undefined8 local_a0;
  char *local_98;
  size_t local_90;
  AlphaNum *local_88;
  undefined8 local_80;
  char *local_78;
  size_type local_70;
  pointer local_68;
  undefined8 local_60;
  char *local_58;
  char *local_50;
  pointer local_48;
  undefined8 local_40;
  char *local_38;
  
  c = (AlphaNum *)usage._M_str;
  pFVar3 = GetFile(this);
  if (pFVar3 == (FileDescriptor *)0x0) {
    pcVar7 = "unknown_file";
    pcVar6 = &DAT_0000000c;
  }
  else {
    pFVar3 = GetFile(this);
    pcVar7 = (pFVar3->name_->_M_dataplus)._M_p;
    pcVar6 = (pointer)pFVar3->name_->_M_string_length;
  }
  sVar8 = full_name(this);
  pSVar2 = this->ptr_;
  if (pSVar2->symbol_type_ == '\x01') {
    bVar1 = pSVar2[2].symbol_type_;
  }
  else {
    if (pSVar2->symbol_type_ != '\x04') {
      local_e0 = 0x40;
      local_d8 = "Attempt to get a visibility error for a non-message/enum symbol ";
      local_140.piece_._M_len = 0xf;
      local_140.piece_._M_str = "\", defined in \"";
      local_170._0_8_ = pcVar6;
      local_170._8_8_ = pcVar7;
      local_110.piece_ = sVar8;
      absl::lts_20250127::StrCat_abi_cxx11_
                (__return_storage_ptr__,(lts_20250127 *)&local_e0,&local_110,&local_140,
                 (AlphaNum *)local_170,in_R9);
      return __return_storage_ptr__;
    }
    bVar1 = pSVar2[1].symbol_type_ >> 2;
  }
  if ((bVar1 & 3) == 1) {
    local_170._0_8_ = local_170 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_170,"It is explicitly marked \'local\'","");
  }
  else {
    local_e0 = 0x54;
    local_d8 = 
    "It defaulted to local from file-level \'option features.default_symbol_visibility = \'";
    pFVar4 = features(this);
    v = (pFVar4->field_0)._impl_.default_symbol_visibility_;
    if (((ulong)v < 5) &&
       (protobuf::internal::
        NameOfDenseEnum<&google::protobuf::FeatureSet_VisibilityFeature_DefaultSymbolVisibility_descriptor,0,4>(int)
        ::deci != 0)) {
      psVar5 = *(string **)
                (protobuf::internal::
                 NameOfDenseEnum<&google::protobuf::FeatureSet_VisibilityFeature_DefaultSymbolVisibility_descriptor,0,4>(int)
                 ::deci + (ulong)v * 8);
    }
    else {
      psVar5 = protobuf::internal::NameOfDenseEnumSlow_abi_cxx11_
                         (v,(DenseEnumCacheInfo *)
                            &protobuf::internal::
                             NameOfDenseEnum<&google::protobuf::FeatureSet_VisibilityFeature_DefaultSymbolVisibility_descriptor,0,4>(int)
                             ::deci);
    }
    local_110.piece_._M_str = (psVar5->_M_dataplus)._M_p;
    local_110.piece_._M_len = psVar5->_M_string_length;
    local_140.piece_._M_len = 2;
    local_140.piece_._M_str = "\';";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_170,(lts_20250127 *)&local_e0,&local_110,&local_140,c);
  }
  local_68 = (other->name_->_M_dataplus)._M_p;
  local_70 = other->name_->_M_string_length;
  local_e0 = 8;
  local_d8 = "Symbol \"";
  local_c0 = 0xf;
  local_b8 = "\", defined in \"";
  local_a0 = 2;
  local_98 = "\" ";
  local_80 = 0x16;
  local_78 = " is not visible from \"";
  local_60 = 3;
  local_58 = "\". ";
  local_50 = (char *)local_170._8_8_;
  local_48 = (pointer)local_170._0_8_;
  local_40 = 0x2c;
  local_38 = " and cannot be accessed outside its own file";
  pieces._M_len = local_170._8_8_;
  pieces._M_array = (iterator)&DAT_0000000b;
  local_d0 = sVar8;
  local_b0 = pcVar6;
  local_a8 = pcVar7;
  local_90 = usage._M_len;
  local_88 = (AlphaNum *)usage._M_str;
  absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_e0,pieces);
  if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
    operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetVisibilityError(FileDescriptor* other,
                                 absl::string_view usage = "") const {
    const absl::string_view file_path =
        GetFile() != nullptr ? GetFile()->name() : "unknown_file";
    const absl::string_view symbol_name = full_name();

    if (!IsType()) {
      return absl::StrCat(
          "Attempt to get a visibility error for a non-message/enum symbol ",
          symbol_name, "\", defined in \"", file_path);
    }

    SymbolVisibility explicit_visibility = visibility_keyword();

    std::string reason =
        explicit_visibility == SymbolVisibility::VISIBILITY_LOCAL
            ? "It is explicitly marked 'local'"
            : absl::StrCat(
                  "It defaulted to local from file-level 'option "
                  "features.default_symbol_visibility = '",
                  FeatureSet_VisibilityFeature_DefaultSymbolVisibility_Name(
                      features().default_symbol_visibility()),
                  "';");

    return absl::StrCat("Symbol \"", symbol_name, "\", defined in \"",
                        file_path, "\" ", usage,
                        " is "
                        "not visible from \"",
                        other->name(), "\". ", reason,
                        " and cannot be accessed outside its own file");
  }